

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O0

int32_t secp256k1_modinv32_divsteps_30
                  (int32_t zeta,uint32_t f0,uint32_t g0,secp256k1_modinv32_trans2x2 *t)

{
  uint uVar1;
  uint uVar2;
  uint *in_RCX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  int i;
  uint32_t z;
  uint32_t y;
  uint32_t x;
  uint32_t g;
  uint32_t f;
  uint32_t mask2;
  uint32_t mask1;
  uint32_t c2;
  uint32_t c1;
  uint32_t r;
  uint32_t q;
  uint32_t v;
  uint32_t u;
  int local_50;
  uint local_40;
  uint local_3c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_4;
  
  local_1c = 1;
  local_20 = 0;
  local_24 = 0;
  local_28 = 1;
  local_50 = 0;
  local_40 = in_EDX;
  local_3c = in_ESI;
  local_4 = in_EDI;
  while( true ) {
    if (0x1d < local_50) {
      *in_RCX = local_1c;
      in_RCX[1] = local_20;
      in_RCX[2] = local_24;
      in_RCX[3] = local_28;
      if ((long)(int)*in_RCX * (long)(int)in_RCX[3] - (long)(int)in_RCX[1] * (long)(int)in_RCX[2] !=
          0x40000000) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv32_impl.h"
                ,0xea,
                "test condition failed: (int64_t)t->u * t->r - (int64_t)t->v * t->q == ((int64_t)1) << 30"
               );
        abort();
      }
      return local_4;
    }
    if ((local_3c & 1) != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv32_impl.h"
              ,0xc2,"test condition failed: (f & 1) == 1");
      abort();
    }
    if (local_1c * in_ESI + local_20 * in_EDX != local_3c << ((byte)local_50 & 0x1f)) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv32_impl.h"
              ,0xc3,"test condition failed: (u * f0 + v * g0) == f << i");
      abort();
    }
    if (local_24 * in_ESI + local_28 * in_EDX != local_40 << ((byte)local_50 & 0x1f)) break;
    uVar1 = (int)local_4 >> 0x1f;
    uVar2 = -(local_40 & 1);
    local_40 = ((local_3c ^ uVar1) - uVar1 & uVar2) + local_40;
    local_24 = ((local_1c ^ uVar1) - uVar1 & uVar2) + local_24;
    local_28 = ((local_20 ^ uVar1) - uVar1 & uVar2) + local_28;
    uVar2 = uVar2 & uVar1;
    local_4 = (local_4 ^ uVar2) - 1;
    local_3c = (local_40 & uVar2) + local_3c;
    local_40 = local_40 >> 1;
    local_1c = ((local_24 & uVar2) + local_1c) * 2;
    local_20 = ((local_28 & uVar2) + local_20) * 2;
    if ((int)local_4 < -0x259 || 0x259 < (int)local_4) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv32_impl.h"
              ,0xdf,"test condition failed: zeta >= -601 && zeta <= 601");
      abort();
    }
    local_50 = local_50 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modinv32_impl.h"
          ,0xc4,"test condition failed: (q * f0 + r * g0) == g << i");
  abort();
}

Assistant:

static int32_t secp256k1_modinv32_divsteps_30(int32_t zeta, uint32_t f0, uint32_t g0, secp256k1_modinv32_trans2x2 *t) {
    /* u,v,q,r are the elements of the transformation matrix being built up,
     * starting with the identity matrix. Semantically they are signed integers
     * in range [-2^30,2^30], but here represented as unsigned mod 2^32. This
     * permits left shifting (which is UB for negative numbers). The range
     * being inside [-2^31,2^31) means that casting to signed works correctly.
     */
    uint32_t u = 1, v = 0, q = 0, r = 1;
    volatile uint32_t c1, c2;
    uint32_t mask1, mask2, f = f0, g = g0, x, y, z;
    int i;

    for (i = 0; i < 30; ++i) {
        VERIFY_CHECK((f & 1) == 1); /* f must always be odd */
        VERIFY_CHECK((u * f0 + v * g0) == f << i);
        VERIFY_CHECK((q * f0 + r * g0) == g << i);
        /* Compute conditional masks for (zeta < 0) and for (g & 1). */
        c1 = zeta >> 31;
        mask1 = c1;
        c2 = g & 1;
        mask2 = -c2;
        /* Compute x,y,z, conditionally negated versions of f,u,v. */
        x = (f ^ mask1) - mask1;
        y = (u ^ mask1) - mask1;
        z = (v ^ mask1) - mask1;
        /* Conditionally add x,y,z to g,q,r. */
        g += x & mask2;
        q += y & mask2;
        r += z & mask2;
        /* In what follows, mask1 is a condition mask for (zeta < 0) and (g & 1). */
        mask1 &= mask2;
        /* Conditionally change zeta into -zeta-2 or zeta-1. */
        zeta = (zeta ^ mask1) - 1;
        /* Conditionally add g,q,r to f,u,v. */
        f += g & mask1;
        u += q & mask1;
        v += r & mask1;
        /* Shifts */
        g >>= 1;
        u <<= 1;
        v <<= 1;
        /* Bounds on zeta that follow from the bounds on iteration count (max 20*30 divsteps). */
        VERIFY_CHECK(zeta >= -601 && zeta <= 601);
    }
    /* Return data in t and return value. */
    t->u = (int32_t)u;
    t->v = (int32_t)v;
    t->q = (int32_t)q;
    t->r = (int32_t)r;
    /* The determinant of t must be a power of two. This guarantees that multiplication with t
     * does not change the gcd of f and g, apart from adding a power-of-2 factor to it (which
     * will be divided out again). As each divstep's individual matrix has determinant 2, the
     * aggregate of 30 of them will have determinant 2^30. */
    VERIFY_CHECK((int64_t)t->u * t->r - (int64_t)t->v * t->q == ((int64_t)1) << 30);
    return zeta;
}